

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PEFile.cpp
# Opt level: O2

bool __thiscall PEFile::_canAddNewSection(PEFile *this)

{
  char cVar1;
  int iVar2;
  undefined4 extraout_var;
  long *plVar3;
  size_t sVar4;
  
  iVar2 = (*(this->super_MappedExe).super_ExeWrappersContainer._vptr_ExeWrappersContainer[2])
                    (&(this->super_MappedExe).super_ExeWrappersContainer,5);
  if (CONCAT44(extraout_var,iVar2) != 0) {
    plVar3 = (long *)__dynamic_cast(CONCAT44(extraout_var,iVar2),&ExeElementWrapper::typeinfo,
                                    &ExeNodeWrapper::typeinfo,0);
    if (plVar3 == (long *)0x0) {
      return false;
    }
    cVar1 = (**(code **)(*plVar3 + 0x138))(plVar3);
    if (cVar1 != '\0') {
      sVar4 = hdrSectionsNum(this);
      return sVar4 != SectHdrsWrapper::SECT_COUNT_MAX;
    }
  }
  return false;
}

Assistant:

bool PEFile::_canAddNewSection()
{
    ExeNodeWrapper* sec = dynamic_cast<ExeNodeWrapper*>(getWrapper(PEFile::WR_SECTIONS));
    if (sec == NULL || sec->canAddEntry() == false) {
        return false;
    }
    const size_t secCount = hdrSectionsNum();
    if (secCount == SectHdrsWrapper::SECT_COUNT_MAX) {
        return false; //limit exceeded
    }
    //TODO: some more checks? overlay?
    return true;
}